

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPAlignedClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPAlignedClause *this)

{
  bool bVar1;
  string clause_string;
  string local_60;
  allocator<char> local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"aligned ",local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"(",(allocator<char> *)&local_60);
  OpenMPClause::expressionToString_abi_cxx11_(&local_60,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,(string *)&this->user_defined_alignment);
  bVar1 = std::operator!=(&local_60,"");
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    std::__cxx11::string::append((char *)local_40);
    std::__cxx11::string::string((string *)&local_60,(string *)&this->user_defined_alignment);
    std::__cxx11::string::append((string *)local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::append((char *)local_40);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPAlignedClause::toString() {

    std::string result = "aligned ";
    std::string clause_string = "(";
    clause_string += this->expressionToString();
    if(this->getUserDefinedAlignment() != ""){
        clause_string += ":";
        clause_string += this->getUserDefinedAlignment();
    }
        clause_string += ") ";
        result += clause_string;
    return result;
}